

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O0

_Bool BitmapDestroy(Bitmap *bitmap)

{
  Bitmap *bitmap_local;
  
  if (bitmap != (Bitmap *)0x0) {
    free(bitmap->pixels);
    free(bitmap);
  }
  else {
    fprintf(_stderr,"%s: trying to free null pointer, ignored.\n","BitmapDestroy");
  }
  return bitmap != (Bitmap *)0x0;
}

Assistant:

bool BitmapDestroy(Bitmap *bitmap) {
  if (bitmap == NULL) {
#ifndef NDEBUG
    fprintf(stderr, "%s: trying to free null pointer, ignored.\n", __FUNCTION_NAME__);
#endif
    return false;
  }
  free(bitmap->pixels);
  free(bitmap);
  return true; // TODO: implement error handler
}